

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:199:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:199:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *pPVar1;
  
  pPVar1 = cin->ptr;
  if (pPVar1 == (ParseStream *)0x0) {
    (((this->f).this)->camera).handedness = LEFT_HANDED;
  }
  else {
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(pPVar1);
    (((this->f).this)->camera).handedness = LEFT_HANDED;
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])(pPVar1);
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }